

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O2

void __thiscall
cppgenerate::Method::printSignature(Method *this,ostream *stream,int indent,bool withAccessModifier)

{
  ostream *poVar1;
  allocator local_41;
  string local_40;
  
  if ((1 < (this->m_name)._M_string_length) && (1 < (this->m_returnType)._M_string_length)) {
    if ((withAccessModifier) && ((ulong)this->m_access < 3)) {
      poVar1 = std::operator<<(stream,&DAT_001160fc +
                                      *(int *)(&DAT_001160fc + (ulong)this->m_access * 4));
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if (1 < (this->m_documentation)._M_string_length) {
      insertSpaces(stream,indent);
      poVar1 = std::operator<<(stream,"/** ");
      poVar1 = std::operator<<(poVar1,(string *)&this->m_documentation);
      poVar1 = std::operator<<(poVar1," */");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    insertSpaces(stream,indent);
    if (this->m_isStatic == true) {
      std::operator<<(stream,"static ");
    }
    if (this->m_isVirtual == true) {
      std::operator<<(stream,"virtual ");
    }
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
    printMethodSignature(this,stream,&local_40,true);
    std::__cxx11::string::~string((string *)&local_40);
    if (this->m_isPureVirtual == true) {
      std::operator<<(stream," = 0");
    }
    poVar1 = std::operator<<(stream,";");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

bool Method::isValid() const {
    return m_name.size() > 1 && m_returnType.size() > 1;
}